

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_net.c
# Opt level: O0

uint socket_get_port(int socket)

{
  uint16_t uVar1;
  int iVar2;
  sockaddr_in *sa4;
  sockaddr_in6 *sa6;
  undefined1 local_90 [4];
  socklen_t len;
  sockaddr_storage sa;
  int socket_local;
  
  sa6._4_4_ = 0x80;
  sa.__ss_align._0_4_ = socket;
  iVar2 = getsockname(socket,(sockaddr *)local_90,(socklen_t *)((long)&sa6 + 4));
  if (iVar2 < 0) {
    sa.__ss_align._4_4_ = 0;
  }
  else if (local_90._0_2_ == 10) {
    uVar1 = ntohs(local_90._2_2_);
    sa.__ss_align._4_4_ = (uint)uVar1;
  }
  else if (local_90._0_2_ == 2) {
    uVar1 = ntohs(local_90._2_2_);
    sa.__ss_align._4_4_ = (uint)uVar1;
  }
  else {
    sa.__ss_align._4_4_ = 0;
  }
  return sa.__ss_align._4_4_;
}

Assistant:

unsigned int socket_get_port(int socket)
{
    struct sockaddr_storage sa;
    socklen_t len = sizeof(sa);
    if (getsockname(socket, (struct sockaddr *)&sa, &len) < 0)
        return 0;

    if (sa.ss_family == AF_INET6)
    {
        struct sockaddr_in6 *sa6 = (struct sockaddr_in6 *)&sa;
        return ntohs(sa6->sin6_port);
    }
    else if (sa.ss_family == AF_INET)
    {
        struct sockaddr_in *sa4 = (struct sockaddr_in *)&sa;
        return ntohs(sa4->sin_port);
    }
    else
        return 0;
}